

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SimdUint8x16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  int iVar1;
  SIMDValue bValue;
  AsmJsSIMDValue result;
  uint8 values [16];
  OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I1);
  result.field_0.i8[8] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I2);
  result.field_0.i8[9] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I3);
  result.field_0.i8[10] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I4);
  result.field_0.i8[0xb] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I5);
  result.field_0.i8[0xc] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I6);
  result.field_0.i8[0xd] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I7);
  result.field_0.i8[0xe] = (Type)iVar1;
  iVar1 = GetRegRawInt<unsigned_short>(this,playout->I8);
  result.field_0.i8[0xf] = (Type)iVar1;
  GetRegRawInt<unsigned_short>(this,playout->I9);
  GetRegRawInt<unsigned_short>(this,playout->I10);
  GetRegRawInt<unsigned_short>(this,playout->I11);
  GetRegRawInt<unsigned_short>(this,playout->I12);
  GetRegRawInt<unsigned_short>(this,playout->I13);
  GetRegRawInt<unsigned_short>(this,playout->I14);
  GetRegRawInt<unsigned_short>(this,playout->I15);
  GetRegRawInt<unsigned_short>(this,playout->I16);
  bValue = SIMDUint8x16Operation::OpUint8x16((uint8 *)(result.field_0.u32 + 2));
  SetRegRawSimd<unsigned_short>(this,playout->U16_0,(AsmJsSIMDValue)bValue.field_0);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SimdUint8x16(const unaligned T* playout)
    {
        uint8 values[16];
        values[0] = (uint8)GetRegRawInt(playout->I1);
        values[1] = (uint8)GetRegRawInt(playout->I2);
        values[2] = (uint8)GetRegRawInt(playout->I3);
        values[3] = (uint8)GetRegRawInt(playout->I4);
        values[4] = (uint8)GetRegRawInt(playout->I5);
        values[5] = (uint8)GetRegRawInt(playout->I6);
        values[6] = (uint8)GetRegRawInt(playout->I7);
        values[7] = (uint8)GetRegRawInt(playout->I8);
        values[8] = (uint8)GetRegRawInt(playout->I9);
        values[9] = (uint8)GetRegRawInt(playout->I10);
        values[10] = (uint8)GetRegRawInt(playout->I11);
        values[11] = (uint8)GetRegRawInt(playout->I12);
        values[12] = (uint8)GetRegRawInt(playout->I13);
        values[13] = (uint8)GetRegRawInt(playout->I14);
        values[14] = (uint8)GetRegRawInt(playout->I15);
        values[15] = (uint8)GetRegRawInt(playout->I16);

        AsmJsSIMDValue result = SIMDUint8x16Operation::OpUint8x16(values);
        SetRegRawSimd(playout->U16_0, result);
    }